

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrumTAP.cpp
# Opt level: O2

void __thiscall Storage::Tape::ZXSpectrumTAP::ZXSpectrumTAP(ZXSpectrumTAP *this,string *file_name)

{
  FileHolder *this_00;
  bool bVar1;
  uint16_t uVar2;
  long lVar3;
  stat *psVar4;
  undefined4 *puVar5;
  
  (this->super_Tape).pulse_.length.length = 0;
  (this->super_Tape).pulse_.length.clock_rate = 1;
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_0058f7a0;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  this->distance_into_phase_ = 0;
  this->block_length_ = 0;
  this->block_type_ = '\0';
  this->data_byte_ = '\0';
  this->phase_ = PilotTone;
  do {
    uVar2 = FileHolder::get16le(this_00);
    bVar1 = FileHolder::eof(this_00);
    if (bVar1) {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0;
      __cxa_throw(puVar5,&{unnamed_type#1}::typeinfo,0);
    }
    FileHolder::seek(this_00,(ulong)uVar2,1);
    lVar3 = FileHolder::tell(this_00);
    psVar4 = FileHolder::stats(this_00);
  } while (lVar3 != psVar4->st_size);
  (*(this->super_Tape)._vptr_Tape[8])(this);
  return;
}

Assistant:

ZXSpectrumTAP::ZXSpectrumTAP(const std::string &file_name) :
	file_(file_name)
{
	// Check for a continuous series of blocks through to
	// exactly file end.
	//
	// To consider: could also check those blocks of type 0
	// and type ff for valid checksums?
	while(true) {
		const uint16_t block_length = file_.get16le();
		if(file_.eof()) throw ErrorNotZXSpectrumTAP;

		file_.seek(block_length, SEEK_CUR);
		if(file_.tell() == file_.stats().st_size) break;
	}

	virtual_reset();
}